

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O0

vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_> *
__thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,initializer_list<int> *collections,
          initializer_list<int> *collections_1,initializer_list<int> *collections_2,
          initializer_list<int> *collections_3)

{
  initializer_list<boost::iterator_range<const_int_*>_> values;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> local_88;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> local_78;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> local_68;
  iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag> local_58;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *local_48;
  undefined8 local_40;
  initializer_list<int> *local_38;
  initializer_list<int> *collections_local_3;
  initializer_list<int> *collections_local_2;
  initializer_list<int> *collections_local_1;
  initializer_list<int> *collections_local;
  make_range_vector_t *this_local;
  
  local_38 = collections_3;
  collections_local_3 = collections_2;
  collections_local_2 = collections_1;
  collections_local_1 = collections;
  collections_local = (initializer_list<int> *)this;
  this_local = (make_range_vector_t *)__return_storage_ptr__;
  local_88 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>)
             boost::make_iterator_range<std::initializer_list<int>>(collections);
  local_78 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>)
             boost::make_iterator_range<std::initializer_list<int>>(collections_local_2);
  local_68 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>)
             boost::make_iterator_range<std::initializer_list<int>>(collections_local_3);
  local_58.super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> =
       (iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>)
       boost::make_iterator_range<std::initializer_list<int>>(local_38);
  local_48 = &local_88;
  local_40 = 4;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x4;
  make_vector<boost::iterator_range<int_const*>>(__return_storage_ptr__,(burst *)local_48,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }